

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_descriptor.cpp
# Opt level: O2

OptionBuilder * __thiscall
program_options::OptionBuilder::operator()(OptionBuilder *this,char *key,char *description)

{
  options_description *this_00;
  __shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  shared_ptr<program_options::option_description> option;
  char *local_38;
  char *description_local;
  char *key_local;
  
  description_local = description;
  key_local = key;
  local_38 = (char *)operator_new(0x10);
  *(undefined ***)local_38 = &PTR__value_base_0017d6d8;
  local_38[8] = '\x01';
  std::
  make_shared<program_options::option_description,char_const*&,program_options::untyped_value*,char_const*&>
            ((char **)&option.
                       super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>
             ,(untyped_value **)&key_local,&local_38);
  this_00 = this->m_root;
  std::__shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_58,
             &option.
              super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>);
  options_description::add(this_00,(shared_ptr<program_options::option_description> *)&_Stack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&option.
              super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return this;
}

Assistant:

OptionBuilder& OptionBuilder::operator()(const char* key, const char* description) {
    auto option = std::make_shared<option_description>(key, new untyped_value(true), description);
    m_root.add(option);
    return *this;
}